

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::get_xdg_dir
                 (Path *__return_storage_ptr__,string *envvarname,string *defaultpath)

{
  char *pcVar1;
  string env_nstr;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  utf8_to_filename(&local_38,envvarname);
  pcVar1 = getenv(local_38._M_dataplus._M_p);
  if (pcVar1 == (char *)0x0) {
    home();
    std::__cxx11::string::string((string *)&local_78,(string *)defaultpath);
    join(__return_storage_ptr__,(Path *)&local_98,&local_78);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
    filename_to_utf8(&local_58,&local_98);
    Path(__return_storage_ptr__,&local_58);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_xdg_dir(const std::string& envvarname, const std::string& defaultpath)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  if (env_value)
    return Path(filename_to_utf8(env_value));

  return Path::home().join(defaultpath);
}